

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwritedeclaration.cpp
# Opt level: O2

void __thiscall CPP::WriteDeclaration::acceptLayout(WriteDeclaration *this,DomLayout *node)

{
  char16_t *pcVar1;
  qsizetype qVar2;
  QTextStream *pQVar3;
  long in_FS_OFFSET;
  Data *pDVar4;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = -0x5555555555555556;
  local_48.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_48.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  Qt::Literals::StringLiterals::operator____s((QString *)&local_48,L"QLayout",7);
  if (node->m_has_attr_class == true) {
    pDVar4 = (node->m_attr_class).d.d;
    pcVar1 = (node->m_attr_class).d.ptr;
    qVar2 = (node->m_attr_class).d.size;
    if (pDVar4 == (Data *)0x0) {
      pDVar4 = (Data *)0x0;
    }
    else {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_68.d = local_48.d;
    local_68.ptr = local_48.ptr;
    local_68.size = local_48.size;
    local_48.d = pDVar4;
    local_48.ptr = pcVar1;
    local_48.size = qVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  pQVar3 = (QTextStream *)QTextStream::operator<<(this->m_output,&this->m_option->indent);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&local_48);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3," *");
  Driver::findOrInsertLayout((QString *)&local_68,this->m_driver,node);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&local_68);
  QTextStream::operator<<(pQVar3,";\n");
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  TreeWalker::acceptLayout(&this->super_TreeWalker,node);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void WriteDeclaration::acceptLayout(DomLayout *node)
{
    QString className = u"QLayout"_s;
    if (node->hasAttributeClass())
        className = node->attributeClass();

    m_output << m_option.indent << className << " *" << m_driver->findOrInsertLayout(node) << ";\n";

    TreeWalker::acceptLayout(node);
}